

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftpack.c
# Opt level: O1

int cfftmf_(int *lot,int *jump,int *n,int *inc,fft_complex_t *c__,int *lenc,double *wsave,
           int *lensav,double *work,int *lenwrk,int *ier)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  double dVar6;
  
  *ier = 0;
  iVar1 = *n;
  iVar4 = 1;
  if ((iVar1 + -1) * *inc + (*lot + -1) * *jump < *lenc) {
    iVar2 = *lensav;
    dVar6 = log((double)iVar1);
    iVar4 = 2;
    if ((int)(dVar6 / 0.6931471805599453) + iVar1 * 2 + 4 <= iVar2) {
      iVar4 = 3;
      if (*lot * *n * 2 <= *lenwrk) {
        iVar1 = *inc;
        iVar2 = *jump;
        iVar3 = iVar1;
        iVar4 = iVar2;
        while (iVar4 != 0) {
          iVar5 = iVar3 % iVar4;
          iVar3 = iVar4;
          iVar4 = iVar5;
        }
        iVar3 = (iVar2 * iVar1) / iVar3;
        if (((*n + -1) * iVar1 < iVar3) || (iVar4 = 4, iVar2 * (*lot + -1) < iVar3))
        goto LAB_0010e368;
      }
    }
  }
  *ier = iVar4;
LAB_0010e368:
  iVar1 = *n;
  if ((long)iVar1 != 1) {
    cmfm1f_(lot,jump,n,inc,c__,work,wsave,wsave + (long)iVar1 * 2,wsave + (long)(iVar1 * 2) + 1);
  }
  return 0;
}

Assistant:

int cfftmf_(int *lot, int *jump, int *n, int
	*inc, complex *c__, int *lenc, fft_real_t *wsave, int *lensav, fft_real_t
	*work, int *lenwrk, int *ier)
{
    /* Builtin functions */


    /* Local variables */
     int iw1;
    extern /* Subroutine */ int cmfm1f_(int *, int *, int *,
	    int *, complex *, fft_real_t *, fft_real_t *, fft_real_t *, fft_real_t *);
    extern logical xercon_(int *, int *, int *, int *);
    extern /* Subroutine */ int xerfft_(char *, int *, ftnlen);


    /* Parameter adjustments */
    --c__;
    --wsave;
    --work;

    /* Function Body */
    *ier = 0;

    if (*lenc < (*lot - 1) * *jump + *inc * (*n - 1) + 1) {
	*ier = 1;
	//xerfft_("CFFTMF ", &c__6, (ftnlen)7);
    } else if (*lensav < (*n << 1) + (int) (log((fft_real_t) (*n)) / log(2.0))
	    + 4) {
	*ier = 2;
	//xerfft_("CFFTMF ", &c__8, (ftnlen)7);
    } else if (*lenwrk < (*lot << 1) * *n) {
	*ier = 3;
	//xerfft_("CFFTMF ", &c__10, (ftnlen)7);
    } else if (! xercon_(inc, jump, n, lot)) {
	*ier = 4;
	//xerfft_("CFFTMF ", &c_n1, (ftnlen)7);
    }

    if (*n == 1) {
	return 0;
    }

    iw1 = *n + *n + 1;
    cmfm1f_(lot, jump, n, inc, &c__[1], &work[1], &wsave[1], &wsave[iw1], &
	    wsave[iw1 + 1]);
    return 0;
}